

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

Vector3d * gmath::averageAngleAxis(Vector3d *__return_storage_ptr__,int n,Vector3d *v)

{
  double dVar1;
  bool bVar2;
  SMatrix<double,_3,_3> *a;
  Matrix33d R0;
  vector<double,_std::allocator<double>_> fvec;
  Matrix33d R;
  Vector3d N;
  SMatrix<double,_3,_3> local_78;
  
  if (n < 1) {
    SVector<double,_3>::SVector(__return_storage_ptr__);
  }
  else if (n == 2) {
    createR(&R0,v);
    createR((Matrix33d *)&fvec,v + 1);
    SVector<double,_3>::SVector(&N);
    transpose<double,3,3>(&local_78,(gmath *)&fvec,a);
    operator*(&R,&local_78,&R0);
    dVar1 = recoverAngleAxis(&R,&N);
    createR(&local_78,&N,dVar1 * 0.5);
    operator*(&R,(SMatrix<double,_3,_3> *)&fvec,&local_78);
    recoverAngleAxis(__return_storage_ptr__,&R);
  }
  else if (n == 1) {
    SVector<double,_3>::SVector(__return_storage_ptr__,v);
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(&fvec,(ulong)(uint)n,(allocator_type *)&R);
    R0.v[0][0] = v->v[0];
    R0.v[0][1] = v->v[1];
    R0.v[0][2] = v->v[2];
    bVar2 = slmdif(anon_unknown_22::averageAngleAxisOpt,n,3,(double *)&R0,
                   fvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,v,1e-09,1e-09,(long *)0x0,(double *)0x0);
    if (bVar2) {
      __return_storage_ptr__->v[0] = R0.v[0][0];
      __return_storage_ptr__->v[1] = R0.v[0][1];
      __return_storage_ptr__->v[2] = R0.v[0][2];
    }
    else {
      SVector<double,_3>::SVector(__return_storage_ptr__);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&fvec.super__Vector_base<double,_std::allocator<double>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d averageAngleAxis(int n, Vector3d v[])
{
  if (n <= 0)
  {
    return Vector3d();
  }

  if (n == 1)
  {
    return v[0];
  }

  if (n == 2)
  {
    Matrix33d R0=createR(v[0]);
    Matrix33d R1=createR(v[1]);

    Vector3d N;
    double phi=recoverAngleAxis(transpose(R1)*R0, N);
    Matrix33d R=R1*createR(N, phi/2);

    return recoverAngleAxis(R);
  }

  // for all n >= 3

  double x[3];
  std::vector<double> fvec(n);

  // taking first rotation as start value

  x[0]=v[0][0];
  x[1]=v[0][1];
  x[2]=v[0][2];

  // optimize

  if (slmdif(averageAngleAxisOpt, n, 3, x, fvec.data(), v, 1e-9, 1e-9))
  {
    return Vector3d(x[0], x[1], x[2]);
  }

  return Vector3d();
}